

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O3

string * __thiscall
OpenMD::ElementsTable::GetName_abi_cxx11_
          (string *__return_storage_ptr__,ElementsTable *this,int atomicnum)

{
  pointer ppEVar1;
  Element *pEVar2;
  pointer pcVar3;
  
  if (this->init_ == false) {
    Init(this);
  }
  if ((atomicnum < 0) ||
     (ppEVar1 = (this->elements_).
                super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->elements_).
                         super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3) <=
     atomicnum)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Unknown","");
  }
  else {
    pEVar2 = ppEVar1[(uint)atomicnum];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pEVar2->name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pEVar2->name_)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ElementsTable::GetName(int atomicnum) {
    if (!init_) Init();

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size()))
      return ("Unknown");

    return (elements_[atomicnum]->GetName());
  }